

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

IterateResult __thiscall
gl3cts::TransformFeedback::CaptureGeometryInterleaved::iterate(CaptureGeometryInterleaved *this)

{
  ostringstream *this_00;
  _func_int *p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  ContextType CVar8;
  deUint32 dVar9;
  long lVar10;
  char *description;
  uint uVar11;
  TestContext *this_01;
  ulong uVar12;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  lVar10 = (**(code **)(**(long **)(*(long *)(&this->field_0x78 +
                                             (long)this->_vptr_CaptureGeometryInterleaved[-3]) + 8)
                       + 0x18))();
  CVar8.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)(&this->field_0x78 +
                                                  (long)this->_vptr_CaptureGeometryInterleaved[-3])
                                        + 8) + 0x10))();
  bVar2 = glu::contextSupports(CVar8,(ApiType)0x103);
  CVar8.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)(&this->field_0x78 +
                                                  (long)this->_vptr_CaptureGeometryInterleaved[-3])
                                        + 8) + 0x10))();
  bVar3 = glu::contextSupports(CVar8,(ApiType)0x123);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (*(ContextInfo **)
                      (*(long *)(&this->field_0x78 +
                                (long)this->_vptr_CaptureGeometryInterleaved[-3]) + 0x10),
                     "GL_EXT_transform_feedback");
  bVar5 = glu::ContextInfo::isExtensionSupported
                    (*(ContextInfo **)
                      (*(long *)(&this->field_0x78 +
                                (long)this->_vptr_CaptureGeometryInterleaved[-3]) + 0x10),
                     "GL_ARB_geometry_shader4");
  bVar7 = 1;
  if ((bVar4 || bVar2) && (bVar3 || bVar5)) {
    (*this->_vptr_CaptureGeometryInterleaved[3])(this);
    CaptureVertexInterleaved::createFramebuffer
              ((CaptureVertexInterleaved *)
               ((long)&this->_vptr_CaptureGeometryInterleaved +
               (long)this->_vptr_CaptureGeometryInterleaved[-3]));
    (**(code **)(*(long *)((long)&this->_vptr_CaptureGeometryInterleaved +
                          (long)this->_vptr_CaptureGeometryInterleaved[-3]) + 0x38))
              ((_func_int *)
               ((long)&this->_vptr_CaptureGeometryInterleaved +
               (long)this->_vptr_CaptureGeometryInterleaved[-3]));
    CaptureVertexInterleaved::createVertexArrayObject
              ((CaptureVertexInterleaved *)
               ((long)&this->_vptr_CaptureGeometryInterleaved +
               (long)this->_vptr_CaptureGeometryInterleaved[-3]));
    bVar7 = 1;
    uVar12 = 0;
    do {
      (*this->_vptr_CaptureGeometryInterleaved[4])(this,uVar12 & 0xffffffff);
      (**(code **)(lVar10 + 0x1680))
                (*(undefined4 *)
                  (&this->field_0x80 + (long)this->_vptr_CaptureGeometryInterleaved[-3]));
      dVar9 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar9,"glUseProgram call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0xb6f);
      if ((bVar7 & 1) != 0) {
        uVar11 = 0;
        do {
          p_Var1 = this->_vptr_CaptureGeometryInterleaved[-3];
          if ((uVar11 == 2) && (*(long *)(&this->field_0xa8 + (long)p_Var1) == 0)) break;
          (**(code **)(*(long *)((long)&this->_vptr_CaptureGeometryInterleaved + (long)p_Var1) +
                      0x58))((_func_int *)
                             ((long)&this->_vptr_CaptureGeometryInterleaved + (long)p_Var1),uVar11);
          (*this->_vptr_CaptureGeometryInterleaved[5])(this,uVar12 & 0xffffffff);
          cVar6 = (**(code **)(*(long *)((long)&this->_vptr_CaptureGeometryInterleaved +
                                        (long)this->_vptr_CaptureGeometryInterleaved[-3]) + 0x48))
                            ((_func_int *)
                             ((long)&this->_vptr_CaptureGeometryInterleaved +
                             (long)this->_vptr_CaptureGeometryInterleaved[-3]),
                             CaptureVertexInterleaved::s_primitive_cases[uVar12]);
          if (cVar6 == '\0') {
            bVar7 = 0;
            break;
          }
          bVar7 = (**(code **)(*(long *)((long)&this->_vptr_CaptureGeometryInterleaved +
                                        (long)this->_vptr_CaptureGeometryInterleaved[-3]) + 0x50))
                            ((_func_int *)
                             ((long)&this->_vptr_CaptureGeometryInterleaved +
                             (long)this->_vptr_CaptureGeometryInterleaved[-3]),uVar11,
                             s_geometry_interleaved_primitive_cases_xfb[uVar12]);
          bVar2 = uVar11 < 2;
          uVar11 = uVar11 + 1;
        } while ((bVar2 & bVar7) != 0);
      }
      (**(code **)(lVar10 + 0x448))
                (*(undefined4 *)
                  (&this->field_0x80 + (long)this->_vptr_CaptureGeometryInterleaved[-3]));
      *(undefined4 *)(&this->field_0x80 + (long)this->_vptr_CaptureGeometryInterleaved[-3]) = 0;
      dVar9 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar9,"glDeleteProgram call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0xb86);
    } while ((uVar12 < 2) && (uVar12 = uVar12 + 1, (bVar7 & 1) != 0));
  }
  (**(code **)(*(long *)((long)&this->_vptr_CaptureGeometryInterleaved +
                        (long)this->_vptr_CaptureGeometryInterleaved[-3]) + 0x60))
            ((_func_int *)
             ((long)&this->_vptr_CaptureGeometryInterleaved +
             (long)this->_vptr_CaptureGeometryInterleaved[-3]));
  bVar2 = (bVar7 & 1) == 0;
  if (bVar2) {
    this_01 = *(TestContext **)(&this->field_0x8 + (long)this->_vptr_CaptureGeometryInterleaved[-3])
    ;
    description = "Fail";
  }
  else {
    local_1b0._0_8_ =
         *(undefined8 *)
          (**(long **)(&this->field_0x78 + (long)this->_vptr_CaptureGeometryInterleaved[-3]) + 0x10)
    ;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Capture Geometry have passed.",0x1d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    this_01 = *(TestContext **)(&this->field_0x8 + (long)this->_vptr_CaptureGeometryInterleaved[-3])
    ;
    description = "Pass";
  }
  tcu::TestContext::setTestResult(this_01,(uint)bVar2,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::TransformFeedback::CaptureGeometryInterleaved::iterate(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initializations. */
	bool is_at_least_gl_30 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 0)));
	bool is_at_least_gl_32 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 2)));
	bool is_ext_tf_1	   = m_context.getContextInfo().isExtensionSupported("GL_EXT_transform_feedback");
	bool is_arb_gs_4	   = m_context.getContextInfo().isExtensionSupported("GL_ARB_geometry_shader4");

	bool is_ok		= true;
	bool test_error = false;

	/* Tests. */
	try
	{
		if ((is_at_least_gl_30 || is_ext_tf_1) && (is_at_least_gl_32 || is_arb_gs_4))
		{
			fetchLimits();
			createFramebuffer();
			createTransformFeedbackBuffer();
			createVertexArrayObject();

			for (glw::GLuint i_primitive_case = 0;
				 (i_primitive_case < s_geometry_interleaved_primitive_cases_count) && is_ok; ++i_primitive_case)
			{
				buildProgram(i_primitive_case);

				gl.useProgram(m_program);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

				for (glw::GLint i_bind_case = 0; (i_bind_case < BIND_BUFFER_CASES_COUNT) && is_ok; ++i_bind_case)
				{
					if ((i_bind_case == BIND_BUFFER_OFFSET_CASE) && (DE_NULL == m_glBindBufferOffsetEXT))
					{
						continue;
					}

					bindBuffer((BindBufferCase)i_bind_case);

					draw(i_primitive_case);

					is_ok = is_ok && checkFramebuffer(s_primitive_cases[i_primitive_case]);
					is_ok = is_ok &&
							checkTransformFeedbackBuffer((BindBufferCase)i_bind_case,
														 s_geometry_interleaved_primitive_cases_xfb[i_primitive_case]);
				}

				gl.deleteProgram(m_program);

				m_program = 0;

				GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram call failed.");
			}
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
	}

	/* Clean objects. */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		/* Log success. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Capture Geometry have passed."
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}